

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * __thiscall Sections::ToString_abi_cxx11_(string *__return_storage_ptr__,Sections *this)

{
  long lVar1;
  pointer pSVar2;
  size_type __n;
  size_type sVar3;
  size_type sVar4;
  pointer this_00;
  string *this_01;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string right;
  string left;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __n = this->m_max_pad + 4;
  this_00 = (this->m_sections).super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar2 = (this->m_sections).super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (this_00 == pSVar2) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (&this_00->m_left,'\n',0);
    left._M_dataplus._M_p._0_1_ = sVar3 == 0xffffffffffffffff;
    inline_check_non_fatal<bool>
              ((bool *)&left,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
               ,0x205,"ToString","s.m_left.find(\'\\n\') == std::string::npos");
    if ((this_00->m_right)._M_string_length == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&this_00->m_left);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"\n");
    }
    else {
      std::__cxx11::string::string((string *)&left,&this_00->m_left);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                (&left,__n,' ');
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&left);
      right._M_dataplus._M_p = (pointer)&right.field_2;
      right._M_string_length = 0;
      this_01 = &this_00->m_right;
      right.field_2._M_local_buf[0] = '\0';
      sVar4 = 0;
      sVar3 = 0;
      do {
        sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(this_01,'\n',sVar4);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_98,this_01,sVar3,sVar4 - sVar3);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&right,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        if (sVar4 == 0xffffffffffffffff) break;
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_construct(&local_b8,__n,' ');
        std::operator+(&local_98,"\n",&local_b8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&right,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_b8);
        sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find_first_not_of(this_01,' ',sVar4 + 1);
        sVar4 = sVar3 + 1;
      } while (sVar4 != 0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&right);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"\n");
      std::__cxx11::string::~string((string *)&right);
      std::__cxx11::string::~string((string *)&left);
    }
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

std::string ToString() const
    {
        std::string ret;
        const size_t pad = m_max_pad + 4;
        for (const auto& s : m_sections) {
            // The left part of a section is assumed to be a single line, usually it is the name of the JSON struct or a
            // brace like {, }, [, or ]
            CHECK_NONFATAL(s.m_left.find('\n') == std::string::npos);
            if (s.m_right.empty()) {
                ret += s.m_left;
                ret += "\n";
                continue;
            }

            std::string left = s.m_left;
            left.resize(pad, ' ');
            ret += left;

            // Properly pad after newlines
            std::string right;
            size_t begin = 0;
            size_t new_line_pos = s.m_right.find_first_of('\n');
            while (true) {
                right += s.m_right.substr(begin, new_line_pos - begin);
                if (new_line_pos == std::string::npos) {
                    break; //No new line
                }
                right += "\n" + std::string(pad, ' ');
                begin = s.m_right.find_first_not_of(' ', new_line_pos + 1);
                if (begin == std::string::npos) {
                    break; // Empty line
                }
                new_line_pos = s.m_right.find_first_of('\n', begin + 1);
            }
            ret += right;
            ret += "\n";
        }
        return ret;
    }